

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall
TokenSequenceParser::addEntry
          (TokenSequenceParser *this,int result,TokenSequence tokens,TokenValueSequence values)

{
  Entry entry;
  allocator_type local_5a;
  allocator_type local_59;
  value_type local_58;
  
  std::vector<TokenType,_std::allocator<TokenType>_>::vector(&local_58.tokens,tokens,&local_59);
  std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::vector
            (&local_58.values,values,&local_5a);
  local_58.result = result;
  std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>::push_back
            (&this->entries,&local_58);
  if (local_58.values.super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.values.
                    super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.values.
                          super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.values.
                          super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.tokens.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.tokens.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.tokens.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.tokens.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TokenSequenceParser::addEntry(int result, TokenSequence tokens, TokenValueSequence values)
{
	Entry entry = { tokens, values, result };
	entries.push_back(entry);
}